

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

FuncDef * sqlite3FindFunction(sqlite3 *db,char *zName,int nArg,u8 enc,u8 createFlag)

{
  int iVar1;
  int iVar2;
  sqlite3 *psVar3;
  byte *p_00;
  byte in_CL;
  int in_EDX;
  Hash *in_RSI;
  long in_RDI;
  char in_R8B;
  u8 *z;
  FuncDef *pOther;
  int score_1;
  int score;
  int nName;
  int h;
  int bestScore;
  FuncDef *pBest;
  FuncDef *p;
  char *in_stack_ffffffffffffffa8;
  sqlite3 *in_stack_ffffffffffffffb0;
  int in_stack_ffffffffffffffbc;
  int local_34;
  sqlite3 *local_30;
  void *data;
  undefined2 in_stack_ffffffffffffffe0;
  sqlite3 *local_8;
  
  local_30 = (sqlite3 *)0x0;
  local_34 = 0;
  iVar1 = sqlite3Strlen30(in_stack_ffffffffffffffa8);
  for (psVar3 = (sqlite3 *)
                sqlite3HashFind((Hash *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
      psVar3 != (sqlite3 *)0x0; psVar3 = (sqlite3 *)psVar3->pDfltColl) {
    iVar2 = matchQuality((FuncDef *)psVar3,in_EDX,in_CL);
    if (local_34 < iVar2) {
      local_34 = iVar2;
      local_30 = psVar3;
    }
  }
  if ((in_R8B == '\0') && ((local_30 == (sqlite3 *)0x0 || ((*(uint *)(in_RDI + 0x2c) & 2) != 0)))) {
    local_34 = 0;
    for (psVar3 = (sqlite3 *)
                  sqlite3FunctionSearch(in_stack_ffffffffffffffbc,(char *)in_stack_ffffffffffffffb0)
        ; psVar3 != (sqlite3 *)0x0; psVar3 = (sqlite3 *)psVar3->pDfltColl) {
      iVar2 = matchQuality((FuncDef *)psVar3,in_EDX,in_CL);
      if (local_34 < iVar2) {
        local_34 = iVar2;
        local_30 = psVar3;
      }
    }
  }
  data = (void *)0x0;
  if (((in_R8B != '\0') && (local_34 < 6)) &&
     (local_30 = (sqlite3 *)
                 sqlite3DbMallocZero(in_stack_ffffffffffffffb0,(u64)in_stack_ffffffffffffffa8),
     local_30 != (sqlite3 *)0x0)) {
    local_30->lastRowid = (i64)&local_30->nSchemaLock;
    *(short *)&local_30->pVfs = (short)in_EDX;
    *(uint *)((long)&local_30->pVfs + 4) = (uint)in_CL;
    memcpy(&local_30->nSchemaLock,in_RSI,(long)(iVar1 + 1));
    for (p_00 = (byte *)local_30->lastRowid; *p_00 != 0; p_00 = p_00 + 1) {
      *p_00 = ""[*p_00];
    }
    psVar3 = (sqlite3 *)
             sqlite3HashInsert(in_RSI,(char *)CONCAT44(in_EDX,CONCAT13(in_CL,CONCAT12(in_R8B,
                                                  in_stack_ffffffffffffffe0))),data);
    if (psVar3 == local_30) {
      sqlite3DbFree(psVar3,p_00);
      sqlite3OomFault(psVar3);
      return (FuncDef *)0x0;
    }
    local_30->pDfltColl = (CollSeq *)psVar3;
  }
  if ((local_30 == (sqlite3 *)0x0) ||
     ((local_30->mutex == (sqlite3_mutex *)0x0 && (in_R8B == '\0')))) {
    local_8 = (sqlite3 *)0x0;
  }
  else {
    local_8 = local_30;
  }
  return (FuncDef *)local_8;
}

Assistant:

SQLITE_PRIVATE FuncDef *sqlite3FindFunction(
  sqlite3 *db,       /* An open database */
  const char *zName, /* Name of the function.  zero-terminated */
  int nArg,          /* Number of arguments.  -1 means any number */
  u8 enc,            /* Preferred text encoding */
  u8 createFlag      /* Create new entry if true and does not otherwise exist */
){
  FuncDef *p;         /* Iterator variable */
  FuncDef *pBest = 0; /* Best match found so far */
  int bestScore = 0;  /* Score of best match */
  int h;              /* Hash value */
  int nName;          /* Length of the name */

  assert( nArg>=(-2) );
  assert( nArg>=(-1) || createFlag==0 );
  nName = sqlite3Strlen30(zName);

  /* First search for a match amongst the application-defined functions.
  */
  p = (FuncDef*)sqlite3HashFind(&db->aFunc, zName);
  while( p ){
    int score = matchQuality(p, nArg, enc);
    if( score>bestScore ){
      pBest = p;
      bestScore = score;
    }
    p = p->pNext;
  }

  /* If no match is found, search the built-in functions.
  **
  ** If the DBFLAG_PreferBuiltin flag is set, then search the built-in
  ** functions even if a prior app-defined function was found.  And give
  ** priority to built-in functions.
  **
  ** Except, if createFlag is true, that means that we are trying to
  ** install a new function.  Whatever FuncDef structure is returned it will
  ** have fields overwritten with new information appropriate for the
  ** new function.  But the FuncDefs for built-in functions are read-only.
  ** So we must not search for built-ins when creating a new function.
  */
  if( !createFlag && (pBest==0 || (db->mDbFlags & DBFLAG_PreferBuiltin)!=0) ){
    bestScore = 0;
    h = SQLITE_FUNC_HASH(sqlite3UpperToLower[(u8)zName[0]], nName);
    p = sqlite3FunctionSearch(h, zName);
    while( p ){
      int score = matchQuality(p, nArg, enc);
      if( score>bestScore ){
        pBest = p;
        bestScore = score;
      }
      p = p->pNext;
    }
  }

  /* If the createFlag parameter is true and the search did not reveal an
  ** exact match for the name, number of arguments and encoding, then add a
  ** new entry to the hash table and return it.
  */
  if( createFlag && bestScore<FUNC_PERFECT_MATCH &&
      (pBest = sqlite3DbMallocZero(db, sizeof(*pBest)+nName+1))!=0 ){
    FuncDef *pOther;
    u8 *z;
    pBest->zName = (const char*)&pBest[1];
    pBest->nArg = (u16)nArg;
    pBest->funcFlags = enc;
    memcpy((char*)&pBest[1], zName, nName+1);
    for(z=(u8*)pBest->zName; *z; z++) *z = sqlite3UpperToLower[*z];
    pOther = (FuncDef*)sqlite3HashInsert(&db->aFunc, pBest->zName, pBest);
    if( pOther==pBest ){
      sqlite3DbFree(db, pBest);
      sqlite3OomFault(db);
      return 0;
    }else{
      pBest->pNext = pOther;
    }
  }

  if( pBest && (pBest->xSFunc || createFlag) ){
    return pBest;
  }
  return 0;
}